

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_dup2(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  int fd2;
  int fd;
  
  iVar1 = JS_ToInt32(ctx,&fd,*argv);
  iVar4 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32(ctx,&fd2,argv[1]);
    if (iVar1 == 0) {
      iVar1 = dup2(fd,fd2);
      uVar3 = js_get_errno((long)iVar1);
      JVar2.ptr = (void *)(uVar3 & 0xffffffff);
      iVar4 = 0;
      goto LAB_00112381;
    }
  }
  JVar2.float64 = 0.0;
LAB_00112381:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_dup2(JSContext *ctx, JSValueConst this_val,
                         int argc, JSValueConst *argv)
{
    int fd, fd2, ret;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &fd2, argv[1]))
        return JS_EXCEPTION;
    ret = js_get_errno(dup2(fd, fd2));
    return JS_NewInt32(ctx, ret);
}